

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O1

void __thiscall
optCompare_nulloptOptNotEmpty_Test::~optCompare_nulloptOptNotEmpty_Test
          (optCompare_nulloptOptNotEmpty_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(optCompare, nulloptOptNotEmpty)
{
  using opt_int = opt<int, opt_null_value_policy<int, -1>>;
  opt_int i{1};
  EXPECT_FALSE(nullopt == i);
  EXPECT_TRUE(nullopt != i);
  EXPECT_TRUE(nullopt < i);
  EXPECT_FALSE(nullopt > i);
  EXPECT_TRUE(nullopt <= i);
  EXPECT_FALSE(nullopt >= i);
}